

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Vec_Int_t * Llb_Nonlin4CreateOrder(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vOrder;
  void *pvVar3;
  Aig_Obj_t *pObj;
  int iVar4;
  int Counter;
  Vec_Int_t *vNodes;
  int local_34;
  Vec_Int_t *local_30;
  
  local_30 = (Vec_Int_t *)0x0;
  local_34 = 0;
  vOrder = Vec_IntStartFull(pAig->vObjs->nSize);
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  for (iVar4 = 0; iVar4 < pAig->nRegs; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar4);
    iVar1 = local_34;
    local_34 = local_34 + 1;
    Vec_IntWriteEntry(vOrder,*(int *)((long)pvVar3 + 0x24),iVar1);
    Llb_Nonlin4CreateOrder_rec
              (pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe),vOrder,
               &local_34);
  }
  for (iVar4 = 0; iVar4 < pAig->vCis->nSize; iVar4 = iVar4 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar4);
    iVar2 = Llb_ObjBddVar(vOrder,pObj);
    iVar1 = local_34;
    if (iVar2 < 0) {
      local_34 = local_34 + 1;
      Vec_IntWriteEntry(vOrder,pObj->Id,iVar1);
    }
  }
  if (local_34 <= pAig->nRegs + pAig->nObjs[2]) {
    Aig_ManCleanMarkA(pAig);
    Vec_IntFreeP(&local_30);
    return vOrder;
  }
  __assert_fail("Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                ,0x178,"Vec_Int_t *Llb_Nonlin4CreateOrder(Aig_Man_t *)");
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrder( Aig_Man_t * pAig )
{
    Vec_Int_t * vNodes = NULL;
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
/*
    // mark internal nodes to be used
    Aig_ManCleanMarkA( pAig );
    vNodes = Llb_Nonlin4CollectHighRefNodes( pAig, 4 );
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        pObj->fMarkA = 1;
printf( "Techmapping added %d pivots.\n", Vec_IntSize(vNodes) );
*/
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4CreateOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
        {
//            if ( Saig_ObjIsLo(pAig, pObj) )
//                Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), Counter++ );
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        }
    assert( Counter <= Aig_ManCiNum(pAig) + Aig_ManRegNum(pAig) + (vNodes?Vec_IntSize(vNodes):0) );
    Aig_ManCleanMarkA( pAig );
    Vec_IntFreeP( &vNodes );
    return vOrder;
}